

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O0

DdNode * cuddZddUnateProduct(DdManager *dd,DdNode *f,DdNode *g)

{
  int iVar1;
  int flag;
  DdNode *zero;
  DdNode *one;
  DdNode *r;
  DdNode *g1;
  DdNode *g0;
  DdNode *f1;
  DdNode *f0;
  DdNode *sum2;
  DdNode *sum1;
  DdNode *term4;
  DdNode *term3;
  DdNode *term2;
  DdNode *term1;
  int local_30;
  int top_g;
  int top_f;
  int v;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)dd->zero;
  if (((((DdManager *)f != dd_local) && ((DdManager *)g != dd_local)) &&
      (dd_local = (DdManager *)g, f != dd->one)) && (dd_local = (DdManager *)f, g != dd->one)) {
    local_30 = dd->permZ[f->index];
    term1._4_4_ = dd->permZ[g->index];
    _top_f = g;
    g_local = f;
    f_local = &dd->sentinel;
    if (term1._4_4_ < local_30) {
      dd_local = (DdManager *)cuddZddUnateProduct(dd,g,f);
    }
    else {
      dd_local = (DdManager *)cuddCacheLookup2Zdd(dd,cuddZddUnateProduct,f,g);
      if (dd_local == (DdManager *)0x0) {
        top_g = g_local->index;
        iVar1 = cuddZddGetCofactors2((DdManager *)f_local,g_local,top_g,&g0,&f1);
        if (iVar1 == 1) {
          dd_local = (DdManager *)0x0;
        }
        else {
          Cudd_Ref(g0);
          Cudd_Ref(f1);
          iVar1 = cuddZddGetCofactors2((DdManager *)f_local,_top_f,top_g,&r,&g1);
          if (iVar1 == 1) {
            Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
            Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
            dd_local = (DdManager *)0x0;
          }
          else {
            Cudd_Ref(r);
            Cudd_Ref(g1);
            term2 = cuddZddUnateProduct((DdManager *)f_local,g0,r);
            if (term2 == (DdNode *)0x0) {
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,r);
              Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
              dd_local = (DdManager *)0x0;
            }
            else {
              Cudd_Ref(term2);
              term3 = cuddZddUnateProduct((DdManager *)f_local,g0,g1);
              if (term3 == (DdNode *)0x0) {
                Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,r);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
                Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                dd_local = (DdManager *)0x0;
              }
              else {
                Cudd_Ref(term3);
                term4 = cuddZddUnateProduct((DdManager *)f_local,f1,r);
                if (term4 == (DdNode *)0x0) {
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,r);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                  Cudd_RecursiveDerefZdd((DdManager *)f_local,term3);
                  dd_local = (DdManager *)0x0;
                }
                else {
                  Cudd_Ref(term4);
                  sum1 = cuddZddUnateProduct((DdManager *)f_local,f1,g1);
                  if (sum1 == (DdNode *)0x0) {
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,r);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,term3);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,term4);
                    dd_local = (DdManager *)0x0;
                  }
                  else {
                    Cudd_Ref(sum1);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,g0);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,f1);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,r);
                    Cudd_RecursiveDerefZdd((DdManager *)f_local,g1);
                    sum2 = cuddZddUnion((DdManager *)f_local,term2,term3);
                    if (sum2 == (DdNode *)0x0) {
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,term3);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,term4);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,sum1);
                      dd_local = (DdManager *)0x0;
                    }
                    else {
                      Cudd_Ref(sum2);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,term2);
                      Cudd_RecursiveDerefZdd((DdManager *)f_local,term3);
                      f0 = cuddZddUnion((DdManager *)f_local,sum2,term4);
                      if (f0 == (DdNode *)0x0) {
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,term4);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,sum1);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,sum2);
                        dd_local = (DdManager *)0x0;
                      }
                      else {
                        Cudd_Ref(f0);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,sum2);
                        Cudd_RecursiveDerefZdd((DdManager *)f_local,term4);
                        dd_local = (DdManager *)cuddZddGetNode((DdManager *)f_local,top_g,f0,sum1);
                        if (dd_local == (DdManager *)0x0) {
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,sum1);
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,f0);
                          dd_local = (DdManager *)0x0;
                        }
                        else {
                          Cudd_Ref((DdNode *)dd_local);
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,f0);
                          Cudd_RecursiveDerefZdd((DdManager *)f_local,sum1);
                          cuddCacheInsert2((DdManager *)f_local,cuddZddUnateProduct,g_local,_top_f,
                                           (DdNode *)dd_local);
                          Cudd_Deref((DdNode *)dd_local);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode  *
cuddZddUnateProduct(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v, top_f, top_g;
    DdNode      *term1, *term2, *term3, *term4;
    DdNode      *sum1, *sum2;
    DdNode      *f0, *f1, *g0, *g1;
    DdNode      *r;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    int         flag;

    statLine(dd);
    if (f == zero || g == zero)
        return(zero);
    if (f == one)
        return(g);
    if (g == one)
        return(f);

    top_f = dd->permZ[f->index];
    top_g = dd->permZ[g->index];

    if (top_f > top_g)
        return(cuddZddUnateProduct(dd, g, f));

    /* Check cache */
    r = cuddCacheLookup2Zdd(dd, cuddZddUnateProduct, f, g);
    if (r)
        return(r);

    v = f->index;       /* either yi or zi */
    flag = cuddZddGetCofactors2(dd, f, v, &f1, &f0);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    flag = cuddZddGetCofactors2(dd, g, v, &g1, &g0);
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);

    term1 = cuddZddUnateProduct(dd, f1, g1);
    if (term1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        return(NULL);
    }
    Cudd_Ref(term1);
    term2 = cuddZddUnateProduct(dd, f1, g0);
    if (term2 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, term1);
        return(NULL);
    }
    Cudd_Ref(term2);
    term3 = cuddZddUnateProduct(dd, f0, g1);
    if (term3 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        return(NULL);
    }
    Cudd_Ref(term3);
    term4 = cuddZddUnateProduct(dd, f0, g0);
    if (term4 == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        Cudd_RecursiveDerefZdd(dd, term3);
        return(NULL);
    }
    Cudd_Ref(term4);
    Cudd_RecursiveDerefZdd(dd, f1);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g1);
    Cudd_RecursiveDerefZdd(dd, g0);
    sum1 = cuddZddUnion(dd, term1, term2);
    if (sum1 == NULL) {
        Cudd_RecursiveDerefZdd(dd, term1);
        Cudd_RecursiveDerefZdd(dd, term2);
        Cudd_RecursiveDerefZdd(dd, term3);
        Cudd_RecursiveDerefZdd(dd, term4);
        return(NULL);
    }
    Cudd_Ref(sum1);
    Cudd_RecursiveDerefZdd(dd, term1);
    Cudd_RecursiveDerefZdd(dd, term2);
    sum2 = cuddZddUnion(dd, sum1, term3);
    if (sum2 == NULL) {
        Cudd_RecursiveDerefZdd(dd, term3);
        Cudd_RecursiveDerefZdd(dd, term4);
        Cudd_RecursiveDerefZdd(dd, sum1);
        return(NULL);
    }
    Cudd_Ref(sum2);
    Cudd_RecursiveDerefZdd(dd, sum1);
    Cudd_RecursiveDerefZdd(dd, term3);
    r = cuddZddGetNode(dd, v, sum2, term4);
    if (r == NULL) {
        Cudd_RecursiveDerefZdd(dd, term4);
        Cudd_RecursiveDerefZdd(dd, sum2);
        return(NULL);
    }
    Cudd_Ref(r);
    Cudd_RecursiveDerefZdd(dd, sum2);
    Cudd_RecursiveDerefZdd(dd, term4);

    cuddCacheInsert2(dd, cuddZddUnateProduct, f, g, r);
    Cudd_Deref(r);
    return(r);

}